

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

void __thiscall
deqp::sl::ShaderCase::dumpValues(ShaderCase *this,ValueBlock *valueBlock,int arrayNdx)

{
  DataType dataType_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  const_reference pvVar8;
  TestLog *this_00;
  MessageBuilder *this_01;
  int local_3f0;
  int local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  MessageBuilder local_388;
  float local_208;
  int local_204;
  float v;
  int elemNdx_1;
  int colNdx;
  int rowNdx;
  int numCols;
  int numRows;
  Element *e;
  int elemNdx;
  int scalarNdx;
  ostringstream result;
  int scalarSize;
  DataType dataType;
  char *valueName;
  Value *val;
  int valNdx;
  int numValues;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  attribValues;
  int arrayNdx_local;
  ValueBlock *valueBlock_local;
  ShaderCase *this_local;
  
  attribValues.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = arrayNdx;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)&valNdx);
  sVar3 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>::
          size(&valueBlock->values);
  for (val._0_4_ = 0; (int)val < (int)sVar3; val._0_4_ = (int)val + 1) {
    pvVar4 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[](&valueBlock->values,(long)(int)val);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    dataType_00 = pvVar4->dataType;
    iVar2 = glu::getDataTypeScalarSize(pvVar4->dataType);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&elemNdx);
    std::operator<<((ostream *)&elemNdx,"    ");
    if (pvVar4->storageType == STORAGE_INPUT) {
      std::operator<<((ostream *)&elemNdx,"input ");
    }
    else if (pvVar4->storageType == STORAGE_UNIFORM) {
      std::operator<<((ostream *)&elemNdx,"uniform ");
    }
    else if (pvVar4->storageType == STORAGE_OUTPUT) {
      std::operator<<((ostream *)&elemNdx,"expected ");
    }
    pcVar6 = glu::getDataTypeName(dataType_00);
    poVar7 = std::operator<<((ostream *)&elemNdx,pcVar6);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = std::operator<<(poVar7,pcVar5);
    std::operator<<(poVar7,":");
    bVar1 = glu::isDataTypeScalar(dataType_00);
    if (bVar1) {
      std::operator<<((ostream *)&elemNdx," ");
    }
    bVar1 = glu::isDataTypeVector(dataType_00);
    if (bVar1) {
      std::operator<<((ostream *)&elemNdx," [ ");
    }
    else {
      bVar1 = glu::isDataTypeMatrix(dataType_00);
      if (bVar1) {
        std::operator<<((ostream *)&elemNdx,"\n");
      }
    }
    bVar1 = glu::isDataTypeScalarOrVector(dataType_00);
    if (bVar1) {
      for (e._4_4_ = 0; e._4_4_ < iVar2; e._4_4_ = e._4_4_ + 1) {
        if (pvVar4->arrayLength == 1) {
          local_3e0 = 0;
        }
        else {
          local_3e0 = attribValues.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        e._0_4_ = local_3e0;
        _numCols = std::
                   vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                   ::operator[](&pvVar4->elements,(long)(local_3e0 * iVar2 + e._4_4_));
        pcVar5 = "";
        if (e._4_4_ != 0) {
          pcVar5 = ", ";
        }
        std::operator<<((ostream *)&elemNdx,pcVar5);
        bVar1 = glu::isDataTypeFloatOrVec(dataType_00);
        if (bVar1) {
          std::ostream::operator<<(&elemNdx,_numCols->float32);
        }
        else {
          bVar1 = glu::isDataTypeIntOrIVec(dataType_00);
          if (bVar1) {
            std::ostream::operator<<(&elemNdx,_numCols->int32);
          }
          else {
            bVar1 = glu::isDataTypeBoolOrBVec(dataType_00);
            if (bVar1) {
              pcVar5 = "false";
              if ((float)_numCols->int32 != 0.0) {
                pcVar5 = "true";
              }
              std::operator<<((ostream *)&elemNdx,pcVar5);
            }
          }
        }
      }
    }
    else {
      bVar1 = glu::isDataTypeMatrix(dataType_00);
      if (bVar1) {
        rowNdx = glu::getDataTypeMatrixNumRows(dataType_00);
        colNdx = glu::getDataTypeMatrixNumColumns(dataType_00);
        for (elemNdx_1 = 0; elemNdx_1 < rowNdx; elemNdx_1 = elemNdx_1 + 1) {
          std::operator<<((ostream *)&elemNdx,"       [ ");
          for (v = 0.0; (int)v < colNdx; v = (float)((int)v + 1)) {
            if (pvVar4->arrayLength == 1) {
              local_3f0 = 0;
            }
            else {
              local_3f0 = attribValues.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            }
            local_204 = local_3f0;
            pvVar8 = std::
                     vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                     ::operator[](&pvVar4->elements,
                                  (long)(local_3f0 * iVar2 + elemNdx_1 * colNdx + (int)v));
            local_208 = pvVar8->float32;
            pcVar5 = ", ";
            if (v == 0.0) {
              pcVar5 = "";
            }
            poVar7 = std::operator<<((ostream *)&elemNdx,pcVar5);
            std::ostream::operator<<(poVar7,local_208);
          }
          std::operator<<((ostream *)&elemNdx," ]\n");
        }
      }
    }
    bVar1 = glu::isDataTypeScalar(dataType_00);
    if (bVar1) {
      std::operator<<((ostream *)&elemNdx,"\n");
    }
    else {
      bVar1 = glu::isDataTypeVector(dataType_00);
      if (bVar1) {
        std::operator<<((ostream *)&elemNdx," ]\n");
      }
    }
    this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_388,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    std::__cxx11::ostringstream::str();
    this_01 = tcu::MessageBuilder::operator<<(&local_388,&local_3a8);
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_3a8);
    tcu::MessageBuilder::~MessageBuilder(&local_388);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&elemNdx);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&valNdx);
  return;
}

Assistant:

void ShaderCase::dumpValues(const ValueBlock& valueBlock, int arrayNdx)
{
	vector<vector<float> > attribValues;

	int numValues = (int)valueBlock.values.size();
	for (int valNdx = 0; valNdx < numValues; valNdx++)
	{
		const ShaderCase::Value& val		= valueBlock.values[valNdx];
		const char*				 valueName  = val.valueName.c_str();
		DataType				 dataType   = val.dataType;
		int						 scalarSize = getDataTypeScalarSize(val.dataType);
		ostringstream			 result;

		result << "    ";
		if (val.storageType == Value::STORAGE_INPUT)
			result << "input ";
		else if (val.storageType == Value::STORAGE_UNIFORM)
			result << "uniform ";
		else if (val.storageType == Value::STORAGE_OUTPUT)
			result << "expected ";

		result << getDataTypeName(dataType) << " " << valueName << ":";

		if (isDataTypeScalar(dataType))
			result << " ";
		if (isDataTypeVector(dataType))
			result << " [ ";
		else if (isDataTypeMatrix(dataType))
			result << "\n";

		if (isDataTypeScalarOrVector(dataType))
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			{
				int					  elemNdx = (val.arrayLength == 1) ? 0 : arrayNdx;
				const Value::Element& e		  = val.elements[elemNdx * scalarSize + scalarNdx];
				result << ((scalarNdx != 0) ? ", " : "");

				if (isDataTypeFloatOrVec(dataType))
					result << e.float32;
				else if (isDataTypeIntOrIVec(dataType))
					result << e.int32;
				else if (isDataTypeBoolOrBVec(dataType))
					result << (e.bool32 ? "true" : "false");
			}
		}
		else if (isDataTypeMatrix(dataType))
		{
			int numRows = getDataTypeMatrixNumRows(dataType);
			int numCols = getDataTypeMatrixNumColumns(dataType);
			for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
			{
				result << "       [ ";
				for (int colNdx = 0; colNdx < numCols; colNdx++)
				{
					int   elemNdx = (val.arrayLength == 1) ? 0 : arrayNdx;
					float v		  = val.elements[elemNdx * scalarSize + rowNdx * numCols + colNdx].float32;
					result << ((colNdx == 0) ? "" : ", ") << v;
				}
				result << " ]\n";
			}
		}

		if (isDataTypeScalar(dataType))
			result << "\n";
		else if (isDataTypeVector(dataType))
			result << " ]\n";

		m_testCtx.getLog() << TestLog::Message << result.str() << TestLog::EndMessage;
	}
}